

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_function_prototype
          (CompilerHLSL *this,SPIRFunction *func,Bitset *return_flags)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  SPIRType *pSVar5;
  spirv_cross local_370 [32];
  SPIRVariable *local_350;
  SPIRVariable *var_1;
  Parameter *local_328;
  Parameter *arg_1;
  Parameter *__end1_1;
  Parameter *__begin1_1;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range1_1;
  SPIRVariable *var;
  undefined1 local_2e0 [72];
  SPIRType *local_298;
  SPIRType *arg_type;
  Parameter *local_270;
  Parameter *arg;
  Parameter *__end1;
  Parameter *__begin1;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range1;
  string local_230 [32];
  string local_210 [8];
  string out_argument;
  undefined1 local_1f0 [8];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  arglist;
  undefined1 local_b8 [64];
  undefined1 local_78 [56];
  SPIRType *type;
  string decl;
  Bitset *return_flags_local;
  SPIRFunction *func_local;
  CompilerHLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(func->super_IVariant).self);
  uVar3 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  if (uVar2 != uVar3) {
    CompilerGLSL::add_function_overload(&this->super_CompilerGLSL,func);
  }
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_CompilerGLSL).local_variable_names,
              &(this->super_CompilerGLSL).resource_names);
  ::std::__cxx11::string::string((string *)&type);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(func->super_IVariant).field_0xc);
  local_78._48_8_ = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  bVar1 = VectorView<unsigned_int>::empty
                    (&(((SPIRType *)local_78._48_8_)->array).super_VectorView<unsigned_int>);
  if (bVar1) {
    CompilerGLSL::flags_to_qualifiers_glsl_abi_cxx11_
              ((CompilerGLSL *)local_78,(SPIRType *)this,(Bitset *)local_78._48_8_);
    ::std::__cxx11::string::operator+=((string *)&type,(string *)local_78);
    ::std::__cxx11::string::~string((string *)local_78);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (local_b8 + 0x20,this,local_78._48_8_,0);
    ::std::__cxx11::string::operator+=((string *)&type,(string *)(local_b8 + 0x20));
    ::std::__cxx11::string::~string((string *)(local_b8 + 0x20));
    ::std::__cxx11::string::operator+=((string *)&type," ");
  }
  else {
    ::std::__cxx11::string::operator=((string *)&type,"void ");
  }
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(func->super_IVariant).self);
  uVar3 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  if (uVar2 == uVar3) {
    get_inner_entry_point_name_abi_cxx11_((CompilerHLSL *)local_b8);
    ::std::__cxx11::string::operator+=((string *)&type,(string *)local_b8);
    ::std::__cxx11::string::~string((string *)local_b8);
    (this->super_CompilerGLSL).processing_entry_point = true;
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(func->super_IVariant).self);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (arglist.stack_storage.aligned_char + 0xf8,this,(ulong)uVar2,1);
    ::std::__cxx11::string::operator+=
              ((string *)&type,(string *)(arglist.stack_storage.aligned_char + 0xf8));
    ::std::__cxx11::string::~string((string *)(arglist.stack_storage.aligned_char + 0xf8));
  }
  ::std::__cxx11::string::operator+=((string *)&type,"(");
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1f0);
  bVar1 = VectorView<unsigned_int>::empty((VectorView<unsigned_int> *)(local_78._48_8_ + 0x20));
  if (!bVar1) {
    ::std::__cxx11::string::string(local_210);
    ::std::__cxx11::string::operator+=(local_210,"out ");
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (local_230,this,local_78._48_8_,0);
    ::std::__cxx11::string::operator+=(local_210,local_230);
    ::std::__cxx11::string::~string(local_230);
    ::std::__cxx11::string::operator+=(local_210," ");
    ::std::__cxx11::string::operator+=(local_210,"spvReturnValue");
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
              (&__range1,this,local_78._48_8_,0);
    ::std::__cxx11::string::operator+=(local_210,(string *)&__range1);
    ::std::__cxx11::string::~string((string *)&__range1);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1f0,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210);
    ::std::__cxx11::string::~string(local_210);
  }
  __begin1 = (Parameter *)&func->arguments;
  __end1 = VectorView<spirv_cross::SPIRFunction::Parameter>::begin
                     ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin1);
  arg = VectorView<spirv_cross::SPIRFunction::Parameter>::end
                  ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin1);
  for (; __end1 != arg; __end1 = __end1 + 1) {
    local_270 = __end1;
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->id);
    uVar4 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x37])(this,(ulong)uVar2);
    if ((uVar4 & 1) == 0) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_270->id);
      CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,uVar2);
      CompilerGLSL::argument_decl_abi_cxx11_((CompilerGLSL *)&arg_type,(Parameter *)this);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1f0,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg_type);
      ::std::__cxx11::string::~string((string *)&arg_type);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)local_270);
      pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
      local_298 = pSVar5;
      if (((0x1e < (this->hlsl_options).shader_model) && (pSVar5->basetype == SampledImage)) &&
         ((pSVar5->image).dim != DimBuffer)) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_270->id);
        bVar1 = Compiler::is_depth_image((Compiler *)this,pSVar5,uVar2);
        local_2e0._32_8_ = "SamplerState ";
        if (bVar1) {
          local_2e0._32_8_ = "SamplerComparisonState ";
        }
        TypedID::operator_cast_to_unsigned_int((TypedID *)&local_270->id);
        to_sampler_expression_abi_cxx11_((CompilerHLSL *)local_2e0,(uint32_t)this);
        pSVar5 = local_298;
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_270->id);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                  (&var,this,pSVar5,(ulong)uVar2);
        join<char_const*,std::__cxx11::string,std::__cxx11::string>
                  ((spirv_cross *)(local_2e0 + 0x28),(char **)(local_2e0 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1f0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_2e0 + 0x28));
        ::std::__cxx11::string::~string((string *)(local_2e0 + 0x28));
        ::std::__cxx11::string::~string((string *)&var);
        ::std::__cxx11::string::~string((string *)local_2e0);
      }
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_270->id);
      __range1_1 = (SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                   Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,uVar2);
      if (__range1_1 != (SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)0x0) {
        *(Parameter **)((long)(__range1_1->stack_storage).aligned_char + 0x90) = local_270;
      }
    }
  }
  __begin1_1 = (Parameter *)&func->shadow_arguments;
  __end1_1 = VectorView<spirv_cross::SPIRFunction::Parameter>::begin
                       ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin1_1);
  arg_1 = VectorView<spirv_cross::SPIRFunction::Parameter>::end
                    ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin1_1);
  for (; __end1_1 != arg_1; __end1_1 = __end1_1 + 1) {
    local_328 = __end1_1;
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1_1->id);
    CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,uVar2);
    CompilerGLSL::argument_decl_abi_cxx11_((CompilerGLSL *)&var_1,(Parameter *)this);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1f0,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var_1);
    ::std::__cxx11::string::~string((string *)&var_1);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_328->id);
    local_350 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,uVar2);
    if (local_350 != (SPIRVariable *)0x0) {
      local_350->parameter = local_328;
    }
  }
  merge(local_370,
        (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
         *)local_1f0,", ");
  ::std::__cxx11::string::operator+=((string *)&type,(string *)local_370);
  ::std::__cxx11::string::~string((string *)local_370);
  ::std::__cxx11::string::operator+=((string *)&type,")");
  CompilerGLSL::statement<std::__cxx11::string&>
            (&this->super_CompilerGLSL,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)local_1f0);
  ::std::__cxx11::string::~string((string *)&type);
  return;
}

Assistant:

void CompilerHLSL::emit_function_prototype(SPIRFunction &func, const Bitset &return_flags)
{
	if (func.self != ir.default_entry_point)
		add_function_overload(func);

	// Avoid shadow declarations.
	local_variable_names = resource_names;

	string decl;

	auto &type = get<SPIRType>(func.return_type);
	if (type.array.empty())
	{
		decl += flags_to_qualifiers_glsl(type, return_flags);
		decl += type_to_glsl(type);
		decl += " ";
	}
	else
	{
		// We cannot return arrays in HLSL, so "return" through an out variable.
		decl = "void ";
	}

	if (func.self == ir.default_entry_point)
	{
		decl += get_inner_entry_point_name();
		processing_entry_point = true;
	}
	else
		decl += to_name(func.self);

	decl += "(";
	SmallVector<string> arglist;

	if (!type.array.empty())
	{
		// Fake array returns by writing to an out array instead.
		string out_argument;
		out_argument += "out ";
		out_argument += type_to_glsl(type);
		out_argument += " ";
		out_argument += "spvReturnValue";
		out_argument += type_to_array_glsl(type, 0);
		arglist.push_back(std::move(out_argument));
	}

	for (auto &arg : func.arguments)
	{
		// Do not pass in separate images or samplers if we're remapping
		// to combined image samplers.
		if (skip_argument(arg.id))
			continue;

		// Might change the variable name if it already exists in this function.
		// SPIRV OpName doesn't have any semantic effect, so it's valid for an implementation
		// to use same name for variables.
		// Since we want to make the GLSL debuggable and somewhat sane, use fallback names for variables which are duplicates.
		add_local_variable_name(arg.id);

		arglist.push_back(argument_decl(arg));

		// Flatten a combined sampler to two separate arguments in modern HLSL.
		auto &arg_type = get<SPIRType>(arg.type);
		if (hlsl_options.shader_model > 30 && arg_type.basetype == SPIRType::SampledImage &&
		    arg_type.image.dim != DimBuffer)
		{
			// Manufacture automatic sampler arg for SampledImage texture
			arglist.push_back(join(is_depth_image(arg_type, arg.id) ? "SamplerComparisonState " : "SamplerState ",
			                       to_sampler_expression(arg.id), type_to_array_glsl(arg_type, arg.id)));
		}

		// Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
			var->parameter = &arg;
	}

	for (auto &arg : func.shadow_arguments)
	{
		// Might change the variable name if it already exists in this function.
		// SPIRV OpName doesn't have any semantic effect, so it's valid for an implementation
		// to use same name for variables.
		// Since we want to make the GLSL debuggable and somewhat sane, use fallback names for variables which are duplicates.
		add_local_variable_name(arg.id);

		arglist.push_back(argument_decl(arg));

		// Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
			var->parameter = &arg;
	}

	decl += merge(arglist);
	decl += ")";
	statement(decl);
}